

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlBufferSetAllocationScheme(xmlBufferPtr buf,xmlBufferAllocationScheme scheme)

{
  xmlBufferAllocationScheme scheme_local;
  xmlBufferPtr buf_local;
  
  if ((((buf != (xmlBufferPtr)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) &&
      (buf->alloc != XML_BUFFER_ALLOC_IO)) &&
     (((scheme == XML_BUFFER_ALLOC_DOUBLEIT || (scheme == XML_BUFFER_ALLOC_EXACT)) ||
      ((scheme == XML_BUFFER_ALLOC_HYBRID || (scheme == XML_BUFFER_ALLOC_IMMUTABLE)))))) {
    buf->alloc = scheme;
  }
  return;
}

Assistant:

void
xmlBufferSetAllocationScheme(xmlBufferPtr buf,
                             xmlBufferAllocationScheme scheme) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufferSetAllocationScheme: buf == NULL\n");
#endif
        return;
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        (buf->alloc == XML_BUFFER_ALLOC_IO)) return;
    if ((scheme == XML_BUFFER_ALLOC_DOUBLEIT) ||
        (scheme == XML_BUFFER_ALLOC_EXACT) ||
        (scheme == XML_BUFFER_ALLOC_HYBRID) ||
        (scheme == XML_BUFFER_ALLOC_IMMUTABLE))
	buf->alloc = scheme;
}